

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emulator.cpp
# Opt level: O0

void __thiscall Emulator::~Emulator(Emulator *this)

{
  Emulator *in_RDI;
  
  ~Emulator(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

Emulator::~Emulator() {
    thread.join();
    delete sound_queue;
    SDL_FreeSurface(surface);
    SDL_DestroyWindow(window);
    SDL_DestroyRenderer(renderer);
    SDL_Quit();
}